

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  uv__queue *__n;
  uv__queue *puVar4;
  int *piVar5;
  char *__s;
  size_t sVar6;
  char *handle;
  void *unaff_R12;
  code *unaff_R14;
  char cVar7;
  uv_loop_t *unaff_R15;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  uv_os_fd_t fds_stdout [2];
  uv_os_fd_t fds_stdin [2];
  uv_process_t child_req;
  uv_write_t write_req;
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdin_child;
  uchar ubuf [1023];
  undefined1 auStack_36e8 [24];
  uv_loop_t *puStack_36d0;
  uv__queue *puStack_36c8;
  uv__queue *puStack_36c0;
  uv_loop_t uStack_36b8;
  uv_loop_t *puStack_32b0;
  void *pvStack_32a8;
  uv_pipe_t *puStack_32a0;
  uv_loop_t *puStack_3298;
  long lStack_3290;
  long lStack_3288;
  uv__queue uStack_3280;
  undefined1 auStack_3270 [16];
  uv__queue *puStack_3260;
  uv__queue *puStack_3258;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_3250;
  void *pvStack_3248;
  undefined8 uStack_3240;
  void *pvStack_3238;
  void *pvStack_3230;
  void *pvStack_3228;
  uv_loop_t auStack_3220 [12];
  uv_loop_t *puStack_978;
  void *pvStack_970;
  uv_pipe_t *puStack_968;
  uv_loop_t *puStack_960;
  long local_950;
  long local_948;
  uv_buf_t local_940;
  uv_os_fd_t local_930;
  uv_os_fd_t local_92c;
  uv_os_fd_t local_928;
  uv_os_fd_t local_924;
  uv_process_t local_920;
  uv_write_t local_8b8;
  uv_pipe_t local_7f0;
  uv_pipe_t local_708;
  undefined1 local_620 [240];
  uv_pipe_t *local_530;
  undefined4 local_528;
  uv_loop_t *local_520;
  uv_pipe_t local_510;
  uv_pipe_t local_428 [4];
  long lVar10;
  
  puStack_960 = (uv_loop_t *)0x1bfed6;
  init_process_options("spawn_helper9",exit_cb);
  puStack_960 = (uv_loop_t *)0x1bfedb;
  puVar3 = uv_default_loop();
  puStack_960 = (uv_loop_t *)0x1bfef0;
  iVar1 = uv_pipe_init(puVar3,&local_510,0);
  local_620._0_8_ = SEXT48(iVar1);
  local_708.data = (void *)0x0;
  if ((void *)local_620._0_8_ == (void *)0x0) {
    puStack_960 = (uv_loop_t *)0x1bff2e;
    iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)local_620,0);
    local_708.data = (void *)(long)iVar1;
    local_7f0.data = (void *)0x0;
    if (local_708.data != (void *)0x0) goto LAB_001c08b8;
    puStack_960 = (uv_loop_t *)0x1bff6c;
    iVar1 = uv_pipe_init(puVar3,&local_708,0);
    local_7f0.data = (void *)(long)iVar1;
    local_8b8.data = (void *)0x0;
    if (local_7f0.data != (void *)0x0) goto LAB_001c08cd;
    puStack_960 = (uv_loop_t *)0x1bffaa;
    iVar1 = uv_pipe_init(puVar3,&local_7f0,0);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c08e2;
    puStack_960 = (uv_loop_t *)0x1bffde;
    iVar1 = uv_pipe(&local_928,0,0);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c08f4;
    puStack_960 = (uv_loop_t *)0x1c0012;
    iVar1 = uv_pipe(&local_930,0,0);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c0906;
    puStack_960 = (uv_loop_t *)0x1c0049;
    iVar1 = uv_pipe_open(&local_510,local_928);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c0918;
    puStack_960 = (uv_loop_t *)0x1c0080;
    iVar1 = uv_pipe_open((uv_pipe_t *)local_620,local_92c);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c092a;
    puStack_960 = (uv_loop_t *)0x1c00b7;
    iVar1 = uv_pipe_open(&local_708,local_924);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c093c;
    puStack_960 = (uv_loop_t *)0x1c00ee;
    iVar1 = uv_pipe_open(&local_7f0,local_930);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_8b8.data != (void *)0x0) goto LAB_001c094e;
    puStack_960 = (uv_loop_t *)0x1c0121;
    iVar1 = uv_is_readable((uv_stream_t *)&local_510);
    if (iVar1 == 0) goto LAB_001c0960;
    puStack_960 = (uv_loop_t *)0x1c0136;
    iVar1 = uv_is_writable((uv_stream_t *)local_620);
    if (iVar1 == 0) goto LAB_001c0965;
    puStack_960 = (uv_loop_t *)0x1c014b;
    iVar1 = uv_is_writable((uv_stream_t *)&local_708);
    if (iVar1 == 0) goto LAB_001c096a;
    puStack_960 = (uv_loop_t *)0x1c0160;
    iVar1 = uv_is_readable((uv_stream_t *)&local_7f0);
    if (iVar1 == 0) goto LAB_001c096f;
    unaff_R14 = (code *)&local_510;
    puStack_960 = (uv_loop_t *)0x1c0178;
    iVar1 = uv_is_writable((uv_stream_t *)unaff_R14);
    unaff_R15 = (uv_loop_t *)local_620;
    puStack_960 = (uv_loop_t *)0x1c018a;
    iVar2 = uv_is_readable((uv_stream_t *)unaff_R15);
    local_8b8.data = (void *)(long)iVar2;
    unaff_R12 = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_8b8.data != unaff_R12) goto LAB_001c0974;
    puStack_960 = (uv_loop_t *)0x1c01bc;
    iVar1 = uv_is_readable((uv_stream_t *)&local_708);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_8b8.data != unaff_R12) goto LAB_001c0986;
    puStack_960 = (uv_loop_t *)0x1c01eb;
    iVar1 = uv_is_writable((uv_stream_t *)&local_7f0);
    local_8b8.data = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_8b8.data != unaff_R12) goto LAB_001c0998;
    options.stdio = (uv_stdio_container_t *)(local_620 + 0xe8);
    local_620._232_4_ = 4;
    local_528 = 4;
    options.stdio_count = 2;
    puStack_960 = (uv_loop_t *)0x1c024c;
    local_530 = (uv_pipe_t *)unaff_R14;
    local_520 = unaff_R15;
    iVar1 = uv_spawn(puVar3,&local_920,&options);
    local_8b8.data = (void *)(long)iVar1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_940.len;
    local_940 = (uv_buf_t)(auVar18 << 0x40);
    if (local_8b8.data != (void *)0x0) goto LAB_001c09aa;
    unaff_R14 = (code *)local_428;
    lVar8 = 0;
    puStack_960 = (uv_loop_t *)0x1c028c;
    uv_close((uv_handle_t *)&local_510,(uv_close_cb)0x0);
    puStack_960 = (uv_loop_t *)0x1c029b;
    uv_close((uv_handle_t *)local_620,(uv_close_cb)0x0);
    puStack_960 = (uv_loop_t *)0x1c02ad;
    local_940 = uv_buf_init((char *)local_428,0x3ff);
    auVar9 = _DAT_00205a10;
    auVar11 = _DAT_00205a20;
    auVar12 = _DAT_00205a30;
    auVar13 = _DAT_00205a40;
    auVar14 = _DAT_00205a50;
    auVar15 = _DAT_00205a60;
    auVar16 = _DAT_00205a70;
    auVar17 = _DAT_00205a80;
    do {
      auVar18 = auVar17 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar27._4_4_ = iVar1;
      auVar27._0_4_ = iVar1;
      auVar27._8_4_ = iVar2;
      auVar27._12_4_ = iVar2;
      auVar35._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar35._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar19._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar19._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar19._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar19._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar19 = auVar19 & auVar35;
      auVar18 = pshuflw(auVar27,auVar19,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      cVar7 = (char)lVar8;
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].data + lVar8) = cVar7;
      }
      auVar18 = packssdw(auVar19,auVar19);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].data + lVar8 + 1) = cVar7 + '\x01';
      }
      auVar18 = auVar16 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar28._4_4_ = iVar1;
      auVar28._0_4_ = iVar1;
      auVar28._8_4_ = iVar2;
      auVar28._12_4_ = iVar2;
      auVar36._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar36._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar20._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar20._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar20._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar20._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar20 = auVar20 & auVar36;
      auVar18 = packssdw(auVar28,auVar20);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)&local_428[0].data + lVar8 + 2) = cVar7 + '\x02';
      }
      auVar18 = pshufhw(auVar20,auVar20,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)&local_428[0].data + lVar8 + 3) = cVar7 + '\x03';
      }
      auVar18 = auVar15 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar29._4_4_ = iVar1;
      auVar29._0_4_ = iVar1;
      auVar29._8_4_ = iVar2;
      auVar29._12_4_ = iVar2;
      auVar37._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar37._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar21._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar21._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar21._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar21._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar21 = auVar21 & auVar37;
      auVar18 = pshuflw(auVar29,auVar21,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].data + lVar8 + 4) = cVar7 + '\x04';
      }
      auVar18 = packssdw(auVar21,auVar21);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].data + lVar8 + 5) = cVar7 + '\x05';
      }
      auVar18 = auVar14 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar30._4_4_ = iVar1;
      auVar30._0_4_ = iVar1;
      auVar30._8_4_ = iVar2;
      auVar30._12_4_ = iVar2;
      auVar38._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar38._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar22._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar38;
      auVar18 = packssdw(auVar30,auVar22);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].data + lVar8 + 6) = cVar7 + '\x06';
      }
      auVar18 = pshufhw(auVar22,auVar22,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].data + lVar8 + 7) = cVar7 + '\a';
      }
      auVar18 = auVar13 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar31._4_4_ = iVar1;
      auVar31._0_4_ = iVar1;
      auVar31._8_4_ = iVar2;
      auVar31._12_4_ = iVar2;
      auVar39._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar39._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar23._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar39;
      auVar18 = pshuflw(auVar31,auVar23,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].loop + lVar8) = cVar7 + '\b';
      }
      auVar18 = packssdw(auVar23,auVar23);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 1) = cVar7 + '\t';
      }
      auVar18 = auVar12 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar32._4_4_ = iVar1;
      auVar32._0_4_ = iVar1;
      auVar32._8_4_ = iVar2;
      auVar32._12_4_ = iVar2;
      auVar40._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar40._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar40._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar40._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar24._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar40;
      auVar18 = packssdw(auVar32,auVar24);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 2) = cVar7 + '\n';
      }
      auVar18 = pshufhw(auVar24,auVar24,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 3) = cVar7 + '\v';
      }
      auVar18 = auVar11 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar33._4_4_ = iVar1;
      auVar33._0_4_ = iVar1;
      auVar33._8_4_ = iVar2;
      auVar33._12_4_ = iVar2;
      auVar41._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar41._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar41._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar41._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar25._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar25 = auVar25 & auVar41;
      auVar18 = pshuflw(auVar33,auVar25,0xe8);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 4) = cVar7 + '\f';
      }
      auVar18 = packssdw(auVar25,auVar25);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 5) = cVar7 + '\r';
      }
      auVar18 = auVar9 ^ _DAT_00205aa0;
      iVar1 = auVar18._0_4_;
      iVar2 = auVar18._8_4_;
      auVar34._4_4_ = iVar1;
      auVar34._0_4_ = iVar1;
      auVar34._8_4_ = iVar2;
      auVar34._12_4_ = iVar2;
      auVar42._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar42._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar42._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar42._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar26._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar26._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
      auVar26._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar26._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
      auVar26 = auVar26 & auVar42;
      auVar18 = packssdw(auVar34,auVar26);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 6) = cVar7 + '\x0e';
      }
      auVar18 = pshufhw(auVar26,auVar26,0x84);
      auVar18 = packssdw(auVar18,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      if ((auVar18._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_428[0].loop + lVar8 + 7) = cVar7 + '\x0f';
      }
      lVar8 = lVar8 + 0x10;
      lVar10 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 0x10;
      auVar17._8_8_ = lVar10 + 0x10;
      lVar10 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 0x10;
      auVar16._8_8_ = lVar10 + 0x10;
      lVar10 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 0x10;
      auVar15._8_8_ = lVar10 + 0x10;
      lVar10 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 0x10;
      auVar14._8_8_ = lVar10 + 0x10;
      lVar10 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 0x10;
      auVar13._8_8_ = lVar10 + 0x10;
      lVar10 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 0x10;
      auVar12._8_8_ = lVar10 + 0x10;
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 0x10;
      auVar11._8_8_ = lVar10 + 0x10;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 0x10;
      auVar9._8_8_ = lVar10 + 0x10;
    } while (lVar8 != 0x400);
    puStack_960 = (uv_loop_t *)0x1c0720;
    memset(output,0,0x3ff);
    puStack_960 = (uv_loop_t *)0x1c0746;
    iVar1 = uv_write(&local_8b8,(uv_stream_t *)&local_708,&local_940,1,write_cb);
    local_948 = (long)iVar1;
    local_950 = 0;
    unaff_R15 = (uv_loop_t *)0x400;
    if (local_948 != 0) goto LAB_001c09bc;
    puStack_960 = (uv_loop_t *)0x1c0781;
    iVar1 = uv_read_start((uv_stream_t *)&local_7f0,on_alloc,on_read);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c09cb;
    puStack_960 = (uv_loop_t *)0x1c07ab;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c09da;
    local_948 = 1;
    local_950 = (long)exit_cb_called;
    if (local_950 != 1) goto LAB_001c09e9;
    local_948 = 3;
    local_950 = (long)close_cb_called;
    if (local_950 != 3) goto LAB_001c09f8;
    puStack_960 = (uv_loop_t *)0x1c0829;
    iVar1 = memcmp(unaff_R14,output,0x3ff);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c0a07;
    puStack_960 = (uv_loop_t *)0x1c085a;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_960 = (uv_loop_t *)0x1c0864;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_948 = 0;
    puStack_960 = (uv_loop_t *)0x1c0875;
    iVar1 = uv_loop_close(puVar3);
    local_950 = (long)iVar1;
    if (local_948 == local_950) {
      puStack_960 = (uv_loop_t *)0x1c0891;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_960 = (uv_loop_t *)0x1c08b8;
    run_test_spawn_inherit_streams_cold_1();
LAB_001c08b8:
    puStack_960 = (uv_loop_t *)0x1c08cd;
    run_test_spawn_inherit_streams_cold_2();
LAB_001c08cd:
    puStack_960 = (uv_loop_t *)0x1c08e2;
    run_test_spawn_inherit_streams_cold_3();
LAB_001c08e2:
    puStack_960 = (uv_loop_t *)0x1c08f4;
    run_test_spawn_inherit_streams_cold_4();
LAB_001c08f4:
    puStack_960 = (uv_loop_t *)0x1c0906;
    run_test_spawn_inherit_streams_cold_5();
LAB_001c0906:
    puStack_960 = (uv_loop_t *)0x1c0918;
    run_test_spawn_inherit_streams_cold_6();
LAB_001c0918:
    puStack_960 = (uv_loop_t *)0x1c092a;
    run_test_spawn_inherit_streams_cold_7();
LAB_001c092a:
    puStack_960 = (uv_loop_t *)0x1c093c;
    run_test_spawn_inherit_streams_cold_8();
LAB_001c093c:
    puStack_960 = (uv_loop_t *)0x1c094e;
    run_test_spawn_inherit_streams_cold_9();
LAB_001c094e:
    puStack_960 = (uv_loop_t *)0x1c0960;
    run_test_spawn_inherit_streams_cold_10();
LAB_001c0960:
    puStack_960 = (uv_loop_t *)0x1c0965;
    run_test_spawn_inherit_streams_cold_25();
LAB_001c0965:
    puStack_960 = (uv_loop_t *)0x1c096a;
    run_test_spawn_inherit_streams_cold_24();
LAB_001c096a:
    puStack_960 = (uv_loop_t *)0x1c096f;
    run_test_spawn_inherit_streams_cold_23();
LAB_001c096f:
    puStack_960 = (uv_loop_t *)0x1c0974;
    run_test_spawn_inherit_streams_cold_22();
LAB_001c0974:
    puStack_960 = (uv_loop_t *)0x1c0986;
    run_test_spawn_inherit_streams_cold_11();
LAB_001c0986:
    puStack_960 = (uv_loop_t *)0x1c0998;
    run_test_spawn_inherit_streams_cold_12();
LAB_001c0998:
    puStack_960 = (uv_loop_t *)0x1c09aa;
    run_test_spawn_inherit_streams_cold_13();
LAB_001c09aa:
    puStack_960 = (uv_loop_t *)0x1c09bc;
    run_test_spawn_inherit_streams_cold_14();
LAB_001c09bc:
    puStack_960 = (uv_loop_t *)0x1c09cb;
    run_test_spawn_inherit_streams_cold_15();
LAB_001c09cb:
    puStack_960 = (uv_loop_t *)0x1c09da;
    run_test_spawn_inherit_streams_cold_16();
LAB_001c09da:
    puStack_960 = (uv_loop_t *)0x1c09e9;
    run_test_spawn_inherit_streams_cold_17();
LAB_001c09e9:
    puStack_960 = (uv_loop_t *)0x1c09f8;
    run_test_spawn_inherit_streams_cold_18();
LAB_001c09f8:
    puStack_960 = (uv_loop_t *)0x1c0a07;
    run_test_spawn_inherit_streams_cold_19();
LAB_001c0a07:
    puStack_960 = (uv_loop_t *)0x1c0a16;
    run_test_spawn_inherit_streams_cold_20();
  }
  puStack_960 = (uv_loop_t *)run_test_spawn_exercise_sigchld_issue;
  run_test_spawn_inherit_streams_cold_21();
  pvStack_3238 = (void *)0x0;
  pvStack_3230 = (void *)0x0;
  pvStack_3248 = (void *)0x0;
  uStack_3240._0_4_ = 0;
  uStack_3240._4_4_ = 0;
  puStack_3258 = (uv__queue *)0x0;
  aStack_3250.unused = (void *)0x0;
  loop = (uv_loop_t *)0x0;
  pvStack_3228 = (void *)0x0;
  puStack_3298 = (uv_loop_t *)0x1c0a5f;
  puStack_978 = puVar3;
  pvStack_970 = unaff_R12;
  puStack_968 = (uv_pipe_t *)unaff_R14;
  puStack_960 = unaff_R15;
  init_process_options("spawn_helper1",exit_cb);
  puStack_3298 = (uv_loop_t *)0x1c0a64;
  puVar3 = uv_default_loop();
  puStack_3298 = (uv_loop_t *)0x1c0a7a;
  iVar1 = uv_spawn(puVar3,&process,&options);
  auStack_3220[0].data = (void *)(long)iVar1;
  uStack_3280.next = (uv__queue *)0x0;
  if (auStack_3220[0].data == (void *)0x0) {
    puStack_3260 = &uStack_3280;
    uStack_3280.next = (uv__queue *)0x205ac0;
    loop = (uv_loop_t *)auStack_3270;
    auStack_3270._8_8_ = "program-that-had-better-not-exist";
    uStack_3280.prev = (uv__queue *)0x0;
    auStack_3270._0_8_ = fail_cb;
    pvStack_3248 = (void *)((ulong)pvStack_3248 & 0xffffffff00000000);
    unaff_R12 = (void *)0x0;
    unaff_R14 = close_cb;
    do {
      puStack_3298 = (uv_loop_t *)0x1c0ada;
      puVar3 = uv_default_loop();
      unaff_R15 = (uv_loop_t *)((long)unaff_R12 + (long)(auStack_3220[0].reserved + -7));
      puStack_3298 = (uv_loop_t *)0x1c0af0;
      iVar1 = uv_spawn(puVar3,(uv_process_t *)unaff_R15,(uv_process_options_t *)loop);
      if (iVar1 != -2) {
        lStack_3288 = (long)iVar1;
        lStack_3290 = -0xd;
        if (lStack_3288 != -0xd) {
          puStack_3298 = (uv_loop_t *)0x1c0c0b;
          run_test_spawn_exercise_sigchld_issue_cold_2();
          goto LAB_001c0c0b;
        }
      }
      puStack_3298 = (uv_loop_t *)0x1c0b1e;
      uv_close((uv_handle_t *)unaff_R15,close_cb);
      unaff_R12 = (void *)((long)unaff_R12 + 0x68);
    } while (unaff_R12 != (void *)0x28a0);
    puStack_3298 = (uv_loop_t *)0x1c0b30;
    puVar3 = uv_default_loop();
    puStack_3298 = (uv_loop_t *)0x1c0b3a;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_3288 = (long)iVar1;
    lStack_3290 = 0;
    if (lStack_3288 != 0) goto LAB_001c0c1a;
    lStack_3288 = 1;
    lStack_3290 = (long)exit_cb_called;
    if (lStack_3290 != 1) goto LAB_001c0c27;
    lStack_3288 = 0x65;
    lStack_3290 = (long)close_cb_called;
    if (lStack_3290 == 0x65) {
      puStack_3298 = (uv_loop_t *)0x1c0ba3;
      loop = uv_default_loop();
      puStack_3298 = (uv_loop_t *)0x1c0bb7;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      puStack_3298 = (uv_loop_t *)0x1c0bc1;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_3288 = 0;
      puStack_3298 = (uv_loop_t *)0x1c0bcf;
      puVar3 = uv_default_loop();
      puStack_3298 = (uv_loop_t *)0x1c0bd7;
      iVar1 = uv_loop_close(puVar3);
      lStack_3290 = (long)iVar1;
      if (lStack_3288 == lStack_3290) {
        puStack_3298 = (uv_loop_t *)0x1c0bed;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c0c41;
    }
  }
  else {
LAB_001c0c0b:
    puStack_3298 = (uv_loop_t *)0x1c0c1a;
    run_test_spawn_exercise_sigchld_issue_cold_1();
LAB_001c0c1a:
    puStack_3298 = (uv_loop_t *)0x1c0c27;
    run_test_spawn_exercise_sigchld_issue_cold_3();
LAB_001c0c27:
    puStack_3298 = (uv_loop_t *)0x1c0c34;
    run_test_spawn_exercise_sigchld_issue_cold_4();
  }
  puStack_3298 = (uv_loop_t *)0x1c0c41;
  run_test_spawn_exercise_sigchld_issue_cold_5();
LAB_001c0c41:
  puStack_3298 = (uv_loop_t *)spawn_stdin_stdout;
  run_test_spawn_exercise_sigchld_issue_cold_6();
  puStack_32b0 = loop;
  pvStack_32a8 = unaff_R12;
  puStack_32a0 = (uv_pipe_t *)unaff_R14;
  puStack_3298 = unaff_R15;
LAB_001c0c61:
  puStack_36d0 = (uv_loop_t *)0x1c0c70;
  __n = (uv__queue *)read(0,&uStack_36b8,0x400);
  if (__n == (uv__queue *)0xffffffffffffffff) goto LAB_001c0c80;
  if (__n == (uv__queue *)0x0) {
    return 0;
  }
  goto LAB_001c0c8a;
LAB_001c0c80:
  puStack_36d0 = (uv_loop_t *)0x1c0c85;
  piVar5 = __errno_location();
  if (*piVar5 != 4) {
LAB_001c0c8a:
    puStack_36c8 = (uv__queue *)0x0;
    puVar3 = &uStack_36b8;
    puStack_36c0 = __n;
    if ((long)__n < 1) goto LAB_001c0d09;
LAB_001c0ca5:
    do {
      puStack_36d0 = (uv_loop_t *)0x1c0cb5;
      puVar4 = (uv__queue *)write(1,puVar3,(size_t)__n);
      if (puVar4 == (uv__queue *)0xffffffffffffffff) {
        puStack_36d0 = (uv_loop_t *)0x1c0cc3;
        piVar5 = __errno_location();
        if (*piVar5 == 4) goto LAB_001c0ca5;
      }
      puStack_36c8 = (uv__queue *)0x0;
      puStack_36c0 = puVar4;
      if ((long)puVar4 < 0) {
        puStack_36d0 = (uv_loop_t *)0x1c0d09;
        spawn_stdin_stdout_cold_2();
        unaff_R15 = puVar3;
        goto LAB_001c0d09;
      }
      unaff_R15 = (uv_loop_t *)
                  ((long)((uv_loop_t *)(puVar3->reserved + -7))->reserved + (long)&puVar4[-4].prev);
      __n = (uv__queue *)((long)__n - (long)puVar4);
      puVar3 = unaff_R15;
    } while (__n != (uv__queue *)0x0);
  }
  goto LAB_001c0c61;
LAB_001c0d09:
  puStack_36d0 = (uv_loop_t *)run_test_spawn_relative_path;
  spawn_stdin_stdout_cold_1();
  auStack_36e8._8_8_ = &uStack_36b8;
  auStack_36e8._16_8_ = __n;
  puStack_36d0 = unaff_R15;
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  auStack_36e8._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_36e8._0_8_ == (void *)0x0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      handle = exepath;
      __s = strrchr(exepath,0x5c);
      if (__s == (char *)0x0) goto LAB_001c0f44;
    }
    sVar6 = strlen(__s);
    memmove(__s + 2,__s,sVar6 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    puVar3 = uv_default_loop();
    iVar1 = uv_spawn(puVar3,&process,&options);
    auStack_36e8._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_36e8._0_8_ != (void *)0x0) goto LAB_001c0f03;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_36e8._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_36e8._0_8_ != (void *)0x0) goto LAB_001c0f10;
    auStack_36e8._0_8_ = (void *)0x1;
    if (exit_cb_called != 1) goto LAB_001c0f1d;
    auStack_36e8._0_8_ = (void *)0x1;
    if (close_cb_called != 1) goto LAB_001c0f2a;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_36e8._0_8_ = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if ((void *)auStack_36e8._0_8_ == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c0f03:
    run_test_spawn_relative_path_cold_2();
LAB_001c0f10:
    run_test_spawn_relative_path_cold_3();
LAB_001c0f1d:
    run_test_spawn_relative_path_cold_4();
LAB_001c0f2a:
    run_test_spawn_relative_path_cold_5();
  }
  handle = auStack_36e8;
  run_test_spawn_relative_path_cold_6();
LAB_001c0f44:
  run_test_spawn_relative_path_cold_7();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  uv_os_fd_t fds_stdin[2];
  uv_os_fd_t fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_parent, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_parent, 0));

  ASSERT_OK(uv_pipe(fds_stdin, 0, 0));
  ASSERT_OK(uv_pipe(fds_stdout, 0, 0));

  ASSERT_OK(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdout_child), bidir);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdin_parent), bidir);
  ASSERT_EQ(uv_is_writable((uv_stream_t*) &pipe_stdout_parent), bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT_OK(uv_spawn(loop, &child_req, &options));

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}